

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor.cpp
# Opt level: O2

int __thiscall
booster::aio::epoll_reactor::select
          (epoll_reactor *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  base_fast_reactor *this_00;
  uint uVar1;
  bool bVar2;
  undefined7 extraout_var;
  int flags;
  int op;
  uint uVar4;
  pointer piVar3;
  
  this_00 = &this->super_base_fast_reactor;
  bVar2 = base_fast_reactor::check(this_00,__nfds,(int *)__writefds);
  piVar3 = (pointer)CONCAT71(extraout_var,bVar2);
  if (!bVar2) goto LAB_0017714b;
  uVar1 = (this_00->events_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[__nfds];
  uVar4 = (uint)__readfds;
  if (uVar4 == 0 && uVar1 != 0) {
    op = 2;
    flags = 0;
LAB_0017713c:
    write_flag(this,__nfds,op,flags,(int *)__writefds);
  }
  else {
    if (uVar4 != 0 && uVar1 == 0) {
      flags = (uVar4 & 1) + (uVar4 & 2) * 2;
      op = 1;
      goto LAB_0017713c;
    }
    if (uVar1 != uVar4) {
      flags = (uVar4 & 1) + (uVar4 & 2) * 2;
      op = 3;
      goto LAB_0017713c;
    }
  }
  piVar3 = (this_00->events_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3[__nfds] = uVar4;
LAB_0017714b:
  return (int)piVar3;
}

Assistant:

virtual void select(native_type fd,int flags,int &error)
		{
			if(!check(fd,error))
				return;
			if(events_[fd]!=0 && flags==0)
				write_flag(fd,EPOLL_CTL_DEL,0,error);
			else if(events_[fd]==0 && flags!=0)
				write_flag(fd,EPOLL_CTL_ADD,to_poll_events(flags),error);
			else if(events_[fd]!=flags)
				write_flag(fd,EPOLL_CTL_MOD,to_poll_events(flags),error);
			events_[fd]=flags;

		}